

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# udp_nix.c
# Opt level: O0

int katherine_udp_recv_exact(katherine_udp_t *u,void *data,size_t count)

{
  int *piVar1;
  socklen_t local_3c;
  ulong uStack_38;
  socklen_t addr_len;
  size_t total;
  ssize_t received;
  size_t count_local;
  void *data_local;
  katherine_udp_t *u_local;
  
  uStack_38 = 0;
  local_3c = 0x10;
  received = count;
  count_local = (size_t)data;
  data_local = u;
  while( true ) {
    if ((ulong)received <= uStack_38) {
      return 0;
    }
    total = recvfrom(*data_local,(void *)(count_local + uStack_38),received - uStack_38,0,
                     (sockaddr *)((long)data_local + 0x14),&local_3c);
    if (total == 0xffffffffffffffff) break;
    uStack_38 = total + uStack_38;
  }
  piVar1 = __errno_location();
  return *piVar1;
}

Assistant:

int
katherine_udp_recv_exact(katherine_udp_t* u, void* data, size_t count)
{
    ssize_t received;
    size_t total = 0;
    socklen_t addr_len = sizeof(u->addr_remote);

    while (total < count) {
        received = recvfrom(u->sock, data + total, count - total, 0, (struct sockaddr *) &u->addr_remote, &addr_len);
        if (received == -1) {
            return errno;
        }

        total += received;
    }

#ifdef KATHERINE_DEBUG_UDP
    dump_buffer("Received:", data, received);
#endif /* KATHERINE_DEBUG_UDP */

    return 0;
}